

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O1

void cftf1st(int n,double *a,double *w)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  
  iVar8 = n >> 3;
  uVar3 = iVar8 * 2;
  dVar26 = *a + a[iVar8 * 4];
  iVar1 = iVar8 * 4 + 1;
  dVar28 = a[1] + a[iVar1];
  dVar20 = *a - a[iVar8 * 4];
  dVar17 = a[1] - a[iVar1];
  dVar32 = a[(int)uVar3] + a[iVar8 * 6];
  iVar2 = iVar8 * 2 + 1;
  iVar12 = iVar8 * 6 + 1;
  dVar38 = a[iVar2] + a[iVar12];
  dVar24 = a[(int)uVar3] - a[iVar8 * 6];
  dVar35 = a[iVar2] - a[iVar12];
  *a = dVar26 + dVar32;
  a[1] = dVar28 + dVar38;
  a[(int)uVar3] = dVar26 - dVar32;
  a[iVar2] = dVar28 - dVar38;
  a[iVar8 * 4] = dVar20 - dVar35;
  a[iVar1] = dVar17 + dVar24;
  a[iVar8 * 6] = dVar35 + dVar20;
  a[iVar12] = dVar17 - dVar24;
  dVar17 = w[1];
  dVar20 = w[2];
  dVar24 = w[3];
  lVar4 = (long)(iVar8 + -2);
  if (iVar8 < 5) {
    dVar28 = 0.0;
    dVar26 = 1.0;
    dVar32 = 1.0;
    dVar35 = 0.0;
  }
  else {
    uVar5 = (ulong)uVar3;
    lVar9 = uVar5 - 1;
    lVar13 = uVar5 * 0x10 + -8;
    lVar14 = uVar5 * 0x18 + -8;
    lVar7 = uVar5 * 0x20 + -8;
    lVar6 = uVar5 + 5;
    lVar11 = uVar5 * 0x10 + 0x28;
    lVar15 = uVar5 * 0x18 + 0x28;
    lVar10 = 4;
    dVar38 = 0.0;
    dVar23 = 1.0;
    dVar19 = 1.0;
    dVar22 = 0.0;
    do {
      dVar29 = *(double *)((long)a + lVar11 + -0x18);
      dVar41 = *(double *)((long)a + lVar11 + -0x10);
      dVar25 = a[lVar10 + -2] + dVar29;
      dVar21 = a[lVar10 + -1] + dVar41;
      dVar29 = a[lVar10 + -2] - dVar29;
      dVar41 = a[lVar10 + -1] - dVar41;
      dVar33 = *(double *)((long)a + lVar11 + -8);
      dVar42 = a[lVar10] + dVar33;
      dVar40 = a[lVar10 + 1] + *(double *)((long)a + lVar11);
      dVar33 = a[lVar10] - dVar33;
      dVar30 = a[lVar10 + 1] - *(double *)((long)a + lVar11);
      dVar27 = *(double *)((long)a + lVar15 + -0x18);
      dVar34 = a[lVar6 + -3] + dVar27;
      dVar27 = a[lVar6 + -3] - dVar27;
      dVar43 = *(double *)((long)a + lVar15 + -0x10);
      dVar36 = a[lVar6 + -2] + dVar43;
      dVar43 = a[lVar6 + -2] - dVar43;
      dVar37 = *(double *)((long)a + lVar15 + -8);
      dVar31 = a[lVar6 + -1] + dVar37;
      dVar37 = a[lVar6 + -1] - dVar37;
      dVar18 = a[lVar6] + *(double *)((long)a + lVar15);
      dVar39 = a[lVar6] - *(double *)((long)a + lVar15);
      dVar26 = w[lVar10];
      dVar28 = w[lVar10 + 1];
      dVar32 = w[lVar10 + 2];
      dVar35 = w[lVar10 + 3];
      a[lVar10 + -2] = dVar25 + dVar34;
      a[lVar10 + -1] = dVar21 + dVar36;
      a[lVar10] = dVar42 + dVar31;
      a[lVar10 + 1] = dVar40 + dVar18;
      a[lVar6 + -3] = dVar25 - dVar34;
      a[lVar6 + -2] = dVar21 - dVar36;
      a[lVar6 + -1] = dVar42 - dVar31;
      a[lVar6] = dVar40 - dVar18;
      dVar31 = (dVar19 + dVar26) * dVar20;
      dVar40 = (dVar22 + dVar28) * dVar20;
      dVar19 = dVar29 - dVar43;
      dVar22 = dVar41 + dVar27;
      *(double *)((long)a + lVar11 + -0x18) = dVar31 * dVar19 - dVar22 * dVar40;
      *(double *)((long)a + lVar11 + -0x10) = dVar19 * dVar40 + dVar31 * dVar22;
      dVar19 = dVar33 - dVar39;
      dVar22 = dVar30 + dVar37;
      *(double *)((long)a + lVar11 + -8) = dVar26 * dVar19 - dVar22 * dVar28;
      *(double *)((long)a + lVar11) = dVar19 * dVar28 + dVar26 * dVar22;
      dVar18 = (dVar23 + dVar32) * dVar24;
      dVar21 = (dVar38 + dVar35) * dVar24;
      dVar43 = dVar43 + dVar29;
      dVar41 = dVar41 - dVar27;
      *(double *)((long)a + lVar15 + -0x18) = dVar18 * dVar43 + dVar21 * dVar41;
      *(double *)((long)a + lVar15 + -0x10) = dVar41 * dVar18 - dVar43 * dVar21;
      dVar39 = dVar39 + dVar33;
      dVar30 = dVar30 - dVar37;
      *(double *)((long)a + lVar15 + -8) = dVar32 * dVar39 + dVar35 * dVar30;
      *(double *)((long)a + lVar15) = dVar30 * dVar32 - dVar39 * dVar35;
      dVar38 = *(double *)((long)a + lVar14 + -8);
      dVar42 = a[lVar9 + -1] + dVar38;
      dVar43 = a[lVar9] + *(double *)((long)a + lVar14);
      dVar38 = a[lVar9 + -1] - dVar38;
      dVar39 = a[lVar9] - *(double *)((long)a + lVar14);
      dVar23 = *(double *)((long)a + lVar14 + -0x18);
      dVar37 = a[lVar9 + -3] + dVar23;
      dVar23 = a[lVar9 + -3] - dVar23;
      dVar19 = *(double *)((long)a + lVar14 + -0x10);
      dVar25 = a[lVar9 + -2] + dVar19;
      dVar19 = a[lVar9 + -2] - dVar19;
      dVar22 = *(double *)((long)a + lVar13 + -8);
      dVar29 = *(double *)((long)a + lVar7 + -8);
      dVar44 = dVar22 + dVar29;
      dVar22 = dVar22 - dVar29;
      dVar34 = *(double *)((long)a + lVar13) + *(double *)((long)a + lVar7);
      dVar30 = *(double *)((long)a + lVar13) - *(double *)((long)a + lVar7);
      dVar29 = *(double *)((long)a + lVar13 + -0x18);
      dVar41 = *(double *)((long)a + lVar7 + -0x18);
      dVar36 = dVar29 + dVar41;
      dVar29 = dVar29 - dVar41;
      dVar41 = *(double *)((long)a + lVar13 + -0x10);
      dVar33 = *(double *)((long)a + lVar7 + -0x10);
      dVar27 = dVar41 + dVar33;
      dVar41 = dVar41 - dVar33;
      a[lVar9 + -1] = dVar42 + dVar44;
      a[lVar9] = dVar43 + dVar34;
      a[lVar9 + -3] = dVar37 + dVar36;
      a[lVar9 + -2] = dVar25 + dVar27;
      *(double *)((long)a + lVar13 + -8) = dVar42 - dVar44;
      *(double *)((long)a + lVar13) = dVar43 - dVar34;
      *(double *)((long)a + lVar13 + -0x18) = dVar37 - dVar36;
      *(double *)((long)a + lVar13 + -0x10) = dVar25 - dVar27;
      dVar33 = dVar38 - dVar30;
      dVar27 = dVar39 + dVar22;
      *(double *)((long)a + lVar14 + -8) = dVar40 * dVar33 - dVar27 * dVar31;
      *(double *)((long)a + lVar14) = dVar27 * dVar40 + dVar33 * dVar31;
      dVar33 = dVar23 - dVar41;
      dVar27 = dVar19 + dVar29;
      *(double *)((long)a + lVar14 + -0x18) = dVar28 * dVar33 - dVar27 * dVar26;
      *(double *)((long)a + lVar14 + -0x10) = dVar33 * dVar26 + dVar28 * dVar27;
      dVar30 = dVar30 + dVar38;
      dVar39 = dVar39 - dVar22;
      *(double *)((long)a + lVar7 + -8) = dVar21 * dVar30 + dVar18 * dVar39;
      *(double *)((long)a + lVar7) = dVar39 * dVar21 - dVar30 * dVar18;
      dVar41 = dVar41 + dVar23;
      dVar19 = dVar19 - dVar29;
      *(double *)((long)a + lVar7 + -0x18) = dVar35 * dVar41 + dVar32 * dVar19;
      *(double *)((long)a + lVar7 + -0x10) = dVar19 * dVar35 - dVar41 * dVar32;
      lVar9 = lVar9 + -4;
      lVar13 = lVar13 + -0x20;
      lVar14 = lVar14 + -0x20;
      lVar7 = lVar7 + -0x20;
      lVar6 = lVar6 + 4;
      lVar11 = lVar11 + 0x20;
      lVar15 = lVar15 + 0x20;
      lVar16 = lVar10 + 2;
      lVar10 = lVar10 + 4;
      dVar38 = dVar35;
      dVar23 = dVar32;
      dVar19 = dVar26;
      dVar22 = dVar28;
    } while (lVar16 < lVar4);
  }
  dVar41 = (dVar26 + dVar17) * dVar20;
  dVar20 = (dVar28 + dVar17) * dVar20;
  dVar29 = (dVar32 - dVar17) * dVar24;
  dVar24 = (dVar35 - dVar17) * dVar24;
  lVar13 = (long)(iVar8 * 5);
  dVar38 = a[lVar4] + a[lVar13 + -2];
  dVar23 = a[(long)iVar8 + -1] + a[lVar13 + -1];
  dVar28 = a[lVar4] - a[lVar13 + -2];
  dVar26 = a[(long)iVar8 + -1] - a[lVar13 + -1];
  lVar10 = (long)(iVar8 * 3);
  lVar9 = (long)(iVar8 * 7);
  dVar19 = a[lVar10 + -2] + a[lVar9 + -2];
  dVar22 = a[lVar10 + -1] + a[lVar9 + -1];
  dVar35 = a[lVar10 + -2] - a[lVar9 + -2];
  dVar32 = a[lVar10 + -1] - a[lVar9 + -1];
  a[lVar4] = dVar38 + dVar19;
  a[(long)iVar8 + -1] = dVar23 + dVar22;
  a[lVar10 + -2] = dVar38 - dVar19;
  a[lVar10 + -1] = dVar23 - dVar22;
  dVar38 = dVar28 - dVar32;
  dVar23 = dVar26 + dVar35;
  a[lVar13 + -2] = dVar41 * dVar38 - dVar23 * dVar20;
  a[lVar13 + -1] = dVar38 * dVar20 + dVar41 * dVar23;
  dVar32 = dVar32 + dVar28;
  dVar26 = dVar26 - dVar35;
  a[lVar9 + -2] = dVar29 * dVar32 + dVar24 * dVar26;
  a[lVar9 + -1] = dVar26 * dVar29 - dVar32 * dVar24;
  dVar38 = a[iVar8] + a[lVar13];
  dVar23 = a[(long)iVar8 + 1] + a[lVar13 + 1];
  dVar28 = a[iVar8] - a[lVar13];
  dVar26 = a[(long)iVar8 + 1] - a[lVar13 + 1];
  dVar19 = a[lVar10] + a[lVar9];
  dVar22 = a[lVar10 + 1] + a[lVar9 + 1];
  dVar35 = a[lVar10] - a[lVar9];
  dVar32 = a[lVar10 + 1] - a[lVar9 + 1];
  a[iVar8] = dVar38 + dVar19;
  a[(long)iVar8 + 1] = dVar23 + dVar22;
  a[lVar10] = dVar38 - dVar19;
  a[lVar10 + 1] = dVar23 - dVar22;
  dVar38 = dVar28 - dVar32;
  dVar23 = dVar26 + dVar35;
  a[lVar13] = (dVar38 - dVar23) * dVar17;
  a[lVar13 + 1] = (dVar23 + dVar38) * dVar17;
  dVar32 = dVar32 + dVar28;
  dVar26 = dVar26 - dVar35;
  a[lVar9] = (dVar26 + dVar32) * -dVar17;
  a[lVar9 + 1] = (dVar26 - dVar32) * -dVar17;
  dVar35 = a[(long)iVar8 + 2] + a[lVar13 + 2];
  dVar38 = a[(long)iVar8 + 3] + a[lVar13 + 3];
  dVar28 = a[(long)iVar8 + 2] - a[lVar13 + 2];
  dVar17 = a[(long)iVar8 + 3] - a[lVar13 + 3];
  dVar23 = a[lVar10 + 2] + a[lVar9 + 2];
  dVar19 = a[lVar10 + 3] + a[lVar9 + 3];
  dVar32 = a[lVar10 + 2] - a[lVar9 + 2];
  dVar26 = a[lVar10 + 3] - a[lVar9 + 3];
  a[(long)iVar8 + 2] = dVar35 + dVar23;
  a[(long)iVar8 + 3] = dVar38 + dVar19;
  a[lVar10 + 2] = dVar35 - dVar23;
  a[lVar10 + 3] = dVar38 - dVar19;
  dVar35 = dVar28 - dVar26;
  dVar38 = dVar17 + dVar32;
  a[lVar13 + 2] = dVar20 * dVar35 - dVar38 * dVar41;
  a[lVar13 + 3] = dVar38 * dVar20 + dVar35 * dVar41;
  dVar26 = dVar26 + dVar28;
  dVar17 = dVar17 - dVar32;
  a[lVar9 + 2] = dVar24 * dVar26 + dVar29 * dVar17;
  a[lVar9 + 3] = dVar17 * dVar24 - dVar26 * dVar29;
  return;
}

Assistant:

void cftf1st(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, m, mh;
  double wn4r, csc1, csc3, wk1r, wk1i, wk3r, wk3i,
    wd1r, wd1i, wd3r, wd3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
    y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i;

  mh = n >> 3;
  m = 2 * mh;
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] + a[j2];
  x0i = a[1] + a[j2 + 1];
  x1r = a[0] - a[j2];
  x1i = a[1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[0] = x0r + x2r;
  a[1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  a[j2] = x1r - x3i;
  a[j2 + 1] = x1i + x3r;
  a[j3] = x1r + x3i;
  a[j3 + 1] = x1i - x3r;
  wn4r = w[1];
  csc1 = w[2];
  csc3 = w[3];
  wd1r = 1;
  wd1i = 0;
  wd3r = 1;
  wd3i = 0;
  k = 0;
  for (j = 2; j < mh - 2; j += 4) {
    k += 4;
    wk1r = csc1 * (wd1r + w[k]);
    wk1i = csc1 * (wd1i + w[k + 1]);
    wk3r = csc3 * (wd3r + w[k + 2]);
    wk3i = csc3 * (wd3i + w[k + 3]);
    wd1r = w[k];
    wd1i = w[k + 1];
    wd3r = w[k + 2];
    wd3i = w[k + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] + a[j2];
    x0i = a[j + 1] + a[j2 + 1];
    x1r = a[j] - a[j2];
    x1i = a[j + 1] - a[j2 + 1];
    y0r = a[j + 2] + a[j2 + 2];
    y0i = a[j + 3] + a[j2 + 3];
    y1r = a[j + 2] - a[j2 + 2];
    y1i = a[j + 3] - a[j2 + 3];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 + 2] + a[j3 + 2];
    y2i = a[j1 + 3] + a[j3 + 3];
    y3r = a[j1 + 2] - a[j3 + 2];
    y3i = a[j1 + 3] - a[j3 + 3];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j + 2] = y0r + y2r;
    a[j + 3] = y0i + y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    a[j1 + 2] = y0r - y2r;
    a[j1 + 3] = y0i - y2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1r * x0r - wk1i * x0i;
    a[j2 + 1] = wk1r * x0i + wk1i * x0r;
    x0r = y1r - y3i;
    x0i = y1i + y3r;
    a[j2 + 2] = wd1r * x0r - wd1i * x0i;
    a[j2 + 3] = wd1r * x0i + wd1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3r * x0r + wk3i * x0i;
    a[j3 + 1] = wk3r * x0i - wk3i * x0r;
    x0r = y1r + y3i;
    x0i = y1i - y3r;
    a[j3 + 2] = wd3r * x0r + wd3i * x0i;
    a[j3 + 3] = wd3r * x0i - wd3i * x0r;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] + a[j2];
    x0i = a[j0 + 1] + a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = a[j0 + 1] - a[j2 + 1];
    y0r = a[j0 - 2] + a[j2 - 2];
    y0i = a[j0 - 1] + a[j2 - 1];
    y1r = a[j0 - 2] - a[j2 - 2];
    y1i = a[j0 - 1] - a[j2 - 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    y2r = a[j1 - 2] + a[j3 - 2];
    y2i = a[j1 - 1] + a[j3 - 1];
    y3r = a[j1 - 2] - a[j3 - 2];
    y3i = a[j1 - 1] - a[j3 - 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i + x2i;
    a[j0 - 2] = y0r + y2r;
    a[j0 - 1] = y0i + y2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    a[j1 - 2] = y0r - y2r;
    a[j1 - 1] = y0i - y2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 1] = wk1i * x0i + wk1r * x0r;
    x0r = y1r - y3i;
    x0i = y1i + y3r;
    a[j2 - 2] = wd1i * x0r - wd1r * x0i;
    a[j2 - 1] = wd1i * x0i + wd1r * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3i * x0r + wk3r * x0i;
    a[j3 + 1] = wk3i * x0i - wk3r * x0r;
    x0r = y1r + y3i;
    x0i = y1i - y3r;
    a[j3 - 2] = wd3i * x0r + wd3r * x0i;
    a[j3 - 1] = wd3i * x0i - wd3r * x0r;
  }
  wk1r = csc1 * (wd1r + wn4r);
  wk1i = csc1 * (wd1i + wn4r);
  wk3r = csc3 * (wd3r - wn4r);
  wk3i = csc3 * (wd3i - wn4r);
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0 - 2] + a[j2 - 2];
  x0i = a[j0 - 1] + a[j2 - 1];
  x1r = a[j0 - 2] - a[j2 - 2];
  x1i = a[j0 - 1] - a[j2 - 1];
  x2r = a[j1 - 2] + a[j3 - 2];
  x2i = a[j1 - 1] + a[j3 - 1];
  x3r = a[j1 - 2] - a[j3 - 2];
  x3i = a[j1 - 1] - a[j3 - 1];
  a[j0 - 2] = x0r + x2r;
  a[j0 - 1] = x0i + x2i;
  a[j1 - 2] = x0r - x2r;
  a[j1 - 1] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2 - 2] = wk1r * x0r - wk1i * x0i;
  a[j2 - 1] = wk1r * x0i + wk1i * x0r;
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3 - 2] = wk3r * x0r + wk3i * x0i;
  a[j3 - 1] = wk3r * x0i - wk3i * x0r;
  x0r = a[j0] + a[j2];
  x0i = a[j0 + 1] + a[j2 + 1];
  x1r = a[j0] - a[j2];
  x1i = a[j0 + 1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[j0] = x0r + x2r;
  a[j0 + 1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2] = wn4r * (x0r - x0i);
  a[j2 + 1] = wn4r * (x0i + x0r);
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3] = -wn4r * (x0r + x0i);
  a[j3 + 1] = -wn4r * (x0i - x0r);
  x0r = a[j0 + 2] + a[j2 + 2];
  x0i = a[j0 + 3] + a[j2 + 3];
  x1r = a[j0 + 2] - a[j2 + 2];
  x1i = a[j0 + 3] - a[j2 + 3];
  x2r = a[j1 + 2] + a[j3 + 2];
  x2i = a[j1 + 3] + a[j3 + 3];
  x3r = a[j1 + 2] - a[j3 + 2];
  x3i = a[j1 + 3] - a[j3 + 3];
  a[j0 + 2] = x0r + x2r;
  a[j0 + 3] = x0i + x2i;
  a[j1 + 2] = x0r - x2r;
  a[j1 + 3] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2 + 2] = wk1i * x0r - wk1r * x0i;
  a[j2 + 3] = wk1i * x0i + wk1r * x0r;
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3 + 2] = wk3i * x0r + wk3r * x0i;
  a[j3 + 3] = wk3i * x0i - wk3r * x0r;
}